

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void highbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m128i *round_offset,int shift,__m128i *clip_low,__m128i *clip_high,
               __m128i *mask_max)

{
  CONV_BUF_TYPE *src0_00;
  CONV_BUF_TYPE *src1_00;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 *in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  __m128i mask_0b;
  __m128i m4567;
  __m128i m57;
  __m128i m46;
  __m128i mask_0a;
  __m128i m0123;
  __m128i m13;
  __m128i m02;
  __m128i two_w;
  __m128i one_b;
  __m128i *in_stack_000003d0;
  __m128i *in_stack_000003d8;
  __m128i *in_stack_000003e0;
  int in_stack_000003e8;
  __m128i *in_stack_000003f0;
  __m128i *in_stack_000003f8;
  __m128i *in_stack_00000400;
  undefined4 uStack_f0;
  int src1_stride_00;
  undefined4 uStack_e0;
  int src0_stride_00;
  undefined4 uStack_d0;
  int dst_stride_00;
  uint16_t *dst_00;
  
  dst_00 = (uint16_t *)0x2000200020002;
  do {
    src0_00 = *(CONV_BUF_TYPE **)((long)in_stack_00000008 + (ulong)(in_stack_00000010 * 2));
    src1_00 = *(CONV_BUF_TYPE **)((long)in_stack_00000008 + (ulong)(in_stack_00000010 * 3));
    uStack_d0 = (undefined4)*in_stack_00000008;
    dst_stride_00 = (int)((ulong)*in_stack_00000008 >> 0x20);
    uStack_e0 = (undefined4)*(undefined8 *)((long)in_stack_00000008 + (ulong)in_stack_00000010);
    src0_stride_00 =
         (int)((ulong)*(undefined8 *)((long)in_stack_00000008 + (ulong)in_stack_00000010) >> 0x20);
    auVar5._8_4_ = uStack_d0;
    auVar5._0_8_ = src0_00;
    auVar5._12_4_ = dst_stride_00;
    auVar4._8_4_ = uStack_e0;
    auVar4._0_8_ = src1_00;
    auVar4._12_4_ = src0_stride_00;
    auVar6 = paddusb(auVar5,auVar4);
    auVar7._8_8_ = 0x101010101010101;
    auVar7._0_8_ = 0x101010101010101;
    pmaddubsw(auVar6,auVar7);
    uVar1 = *(undefined8 *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 << 2));
    uStack_f0 = (undefined4)uVar1;
    src1_stride_00 = (int)((ulong)uVar1 >> 0x20);
    auVar3._8_4_ = uStack_f0;
    auVar3._0_8_ = *(undefined8 *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 * 6));
    auVar3._12_4_ = src1_stride_00;
    auVar2._8_8_ = *(undefined8 *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 * 5));
    auVar2._0_8_ = *(undefined8 *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 * 7));
    auVar7 = paddusb(auVar3,auVar2);
    auVar6._8_8_ = 0x101010101010101;
    auVar6._0_8_ = 0x101010101010101;
    pmaddubsw(auVar7,auVar6);
    highbd_blend_a64_d16_mask_w4_sse4_1
              (dst_00,dst_stride_00,src0_00,src0_stride_00,src1_00,src1_stride_00,in_stack_000003d0,
               in_stack_000003d8,in_stack_000003e0,in_stack_000003e8,in_stack_000003f0,
               in_stack_000003f8,in_stack_00000400);
    in_stack_00000008 = (undefined8 *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 << 3));
    in_stack_00000018 = in_stack_00000018 + -4;
  } while (in_stack_00000018 != 0);
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m128i *round_offset, int shift, const __m128i *clip_low,
    const __m128i *clip_high, const __m128i *mask_max) {
  const __m128i one_b = _mm_set1_epi8(1);
  const __m128i two_w = _mm_set1_epi16(2);
  do {
    // Load 8 pixels from each of 8 rows of mask,
    // (saturating) add together rows then use madd to add adjacent pixels
    // Finally, divide each value by 4 (with rounding)
    const __m128i m02 = _mm_set_epi64x(*(int64_t *)(mask),
                                       *(int64_t *)(mask + 2 * mask_stride));
    const __m128i m13 = _mm_set_epi64x(*(int64_t *)(mask + mask_stride),
                                       *(int64_t *)(mask + 3 * mask_stride));
    const __m128i m0123 = _mm_maddubs_epi16(_mm_adds_epu8(m02, m13), one_b);
    const __m128i mask_0a = _mm_srli_epi16(_mm_add_epi16(m0123, two_w), 2);
    const __m128i m46 = _mm_set_epi64x(*(int64_t *)(mask + 4 * mask_stride),
                                       *(int64_t *)(mask + 6 * mask_stride));
    const __m128i m57 = _mm_set_epi64x(*(int64_t *)(mask + 5 * mask_stride),
                                       *(int64_t *)(mask + 7 * mask_stride));
    const __m128i m4567 = _mm_maddubs_epi16(_mm_adds_epu8(m46, m57), one_b);
    const __m128i mask_0b = _mm_srli_epi16(_mm_add_epi16(m4567, two_w), 2);

    highbd_blend_a64_d16_mask_w4_sse4_1(
        dst, dst_stride, src0, src0_stride, src1, src1_stride, &mask_0a,
        &mask_0b, round_offset, shift, clip_low, clip_high, mask_max);

    dst += dst_stride * 4;
    src0 += src0_stride * 4;
    src1 += src1_stride * 4;
    mask += mask_stride * 8;
  } while (h -= 4);
}